

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFFormFieldObjectHelper::getInheritableFieldValue(QPDFFormFieldObjectHelper *this,string *name)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *__r;
  bool bVar1;
  QPDFObjGen og;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar2;
  QPDFObjectHandle node;
  set seen;
  allocator<char> local_a1;
  undefined1 local_a0 [32];
  string local_80;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_60;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_a0,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&name->_M_string_length);
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_a0);
  if (bVar1) {
    QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_a0);
    bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
    if (bVar1) {
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      __r = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0x10);
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_a0);
        bVar1 = QPDFObjGen::set::add((set *)&local_60,og);
        if (!bVar1) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"/Parent",(allocator<char> *)__r);
        bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_a0,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        if (!bVar1) break;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"/Parent",&local_a1);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)__r,(string *)local_a0);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_a0,__r);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0x18));
        std::__cxx11::string::~string((string *)&local_80);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_80,(string *)local_a0);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_80);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
        bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
      } while (bVar1);
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree(&local_60);
    }
  }
  else {
    QPDFObjectHandle::newNull();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFFormFieldObjectHelper::getInheritableFieldValue(std::string const& name)
{
    QPDFObjectHandle node = oh();
    if (!node.isDictionary()) {
        return QPDFObjectHandle::newNull();
    }
    QPDFObjectHandle result(node.getKey(name));
    if (result.isNull()) {
        QPDFObjGen::set seen;
        while (seen.add(node) && node.hasKey("/Parent")) {
            node = node.getKey("/Parent");
            result = node.getKey(name);
            if (!result.isNull()) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper non-trivial inheritance");
                return result;
            }
        }
    }
    return result;
}